

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::MaybeWarnUninitialized(cmMakefile *this,string *variable,char *sourceFilename)

{
  bool bVar1;
  cmake *this_00;
  ostream *poVar2;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream msg;
  char *sourceFilename_local;
  string *variable_local;
  cmMakefile *this_local;
  
  this_00 = GetCMakeInstance(this);
  bVar1 = cmake::GetWarnUninitialized(this_00);
  if (((bVar1) && (bVar1 = VariableInitialized(this,variable), !bVar1)) &&
     (((this->CheckSystemVars & 1U) != 0 ||
      ((sourceFilename != (char *)0x0 && (bVar1 = IsProjectFile(this,sourceFilename), bVar1)))))) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"uninitialized variable \'");
    poVar2 = std::operator<<(poVar2,(string *)variable);
    std::operator<<(poVar2,"\'");
    std::__cxx11::ostringstream::str();
    IssueMessage(this,AUTHOR_WARNING,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void cmMakefile::MaybeWarnUninitialized(std::string const& variable,
                                        const char* sourceFilename) const
{
  // check to see if we need to print a warning
  // if strict mode is on and the variable has
  // not been "cleared"/initialized with a set(foo ) call
  if (this->GetCMakeInstance()->GetWarnUninitialized() &&
      !this->VariableInitialized(variable)) {
    if (this->CheckSystemVars ||
        (sourceFilename && this->IsProjectFile(sourceFilename))) {
      std::ostringstream msg;
      msg << "uninitialized variable \'" << variable << "\'";
      this->IssueMessage(MessageType::AUTHOR_WARNING, msg.str());
    }
  }
}